

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  string *this;
  uint uVar4;
  allocator<char> local_99;
  VEC_INFO vec_info;
  string strAssociation_Path;
  string strKlgFileName;
  
  strAssociation_Path._M_dataplus._M_p = (pointer)&strAssociation_Path.field_2;
  strAssociation_Path._M_string_length = 0;
  strKlgFileName._M_dataplus._M_p = (pointer)&strKlgFileName.field_2;
  strKlgFileName._M_string_length = 0;
  strAssociation_Path.field_2._M_local_buf[0] = '\0';
  strKlgFileName.field_2._M_local_buf[0] = '\0';
  uVar4 = 0;
switchD_00104ded_caseD_70:
  iVar1 = getopt(argc,argv,"worts");
  switch(iVar1) {
  case 0x6f:
    std::__cxx11::string::string<std::allocator<char>>((string *)&vec_info,argv[_optind],&local_99);
    this = &strKlgFileName;
    goto LAB_00104e3a;
  case 0x70:
  case 0x71:
  case 0x75:
  case 0x76:
    goto switchD_00104ded_caseD_70;
  case 0x72:
    g_bFlag_reverse = true;
    break;
  case 0x73:
    __isoc99_sscanf(argv[_optind],"%lf",&g_dScale);
    break;
  case 0x74:
    g_bFlag_TUM = true;
    break;
  case 0x77:
    std::__cxx11::string::string<std::allocator<char>>((string *)&vec_info,argv[_optind],&local_99);
    this = &strWorkingDir_abi_cxx11_;
LAB_00104e3a:
    std::__cxx11::string::operator=((string *)this,(string *)&vec_info);
    std::__cxx11::string::~string((string *)&vec_info);
    break;
  default:
    goto switchD_00104ded_default;
  }
  uVar4 = uVar4 + 1;
  goto switchD_00104ded_caseD_70;
switchD_00104ded_default:
  if (iVar1 == -1) {
    if (uVar4 < 2) {
      fwrite("Usage: ./pngtoklg -w (working directory) -o (klg file name)\n\n-w working directory\n-o output klg filename\n-t TUM format\n-s Scale factor in floating point ex.  \'5000\'\nFor more scale factor detail, please reference: \nhttp://vision.in.tum.de/data/datasets/rgbd-dataset/file_formats#intrinsic_camera_calibration_of_the_kinect\nExample: ./pngtoklg -w ../livingroom_kt0_rs -o liv.klg\nassociations.txt should be in (depth_time)(depth_file)(rgb_time)(rgb_file) order\n"
             ,0x1c9,1,_stderr);
      iVar1 = -1;
    }
    else {
      iVar1 = chdir(strWorkingDir_abi_cxx11_._M_dataplus._M_p);
      if (iVar1 != 0) {
        fwrite("\x1b[0;32;31mdataset path not exist\x1b[m",0x23,1,_stderr);
      }
      pcVar2 = getcwd((char *)0x0,0);
      printf("\nCurrent working directory:\n\t%s\n",pcVar2);
      std::__cxx11::string::_M_assign((string *)&strAssociation_Path);
      if (strWorkingDir_abi_cxx11_._M_dataplus._M_p[strWorkingDir_abi_cxx11_._M_string_length - 1]
          != '/') {
        std::__cxx11::string::push_back((char)&strAssociation_Path);
      }
      std::__cxx11::string::append((char *)&strAssociation_Path);
      vec_info.
      super__Vector_base<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vec_info.
      super__Vector_base<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vec_info.
      super__Vector_base<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar1 = parseInfoFile(&strAssociation_Path,&vec_info);
      if (iVar1 == 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Depth: ");
        poVar3 = std::operator<<(poVar3,(string *)
                                        &vec_info.
                                         super__Vector_base<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish[-1].second);
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,"RGB: ");
        poVar3 = std::operator<<(poVar3,(string *)
                                        &vec_info.
                                         super__Vector_base<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish[-1].second.
                                         second);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::operator<<((ostream *)&std::cout,"scale: ");
        poVar3 = std::ostream::_M_insert<double>(g_dScale);
        std::endl<char,std::char_traits<char>>(poVar3);
        convertToKlg(&vec_info,&strKlgFileName);
        iVar1 = 0;
        std::operator<<((ostream *)&std::cout,"Conversion complete!\n");
      }
      else {
        fwrite("\x1b[0;32;31mFail to find associations.txt under working directory!\n\x1b[m",0x44,1,
               _stderr);
        iVar1 = -1;
      }
      std::
      vector<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(&vec_info);
    }
    std::__cxx11::string::~string((string *)&strKlgFileName);
    std::__cxx11::string::~string((string *)&strAssociation_Path);
    return iVar1;
  }
  goto switchD_00104ded_caseD_70;
}

Assistant:

int main(int argc, char* argv[])
{
    int option_count = 0;
    std::string strAssociation_Path;
    std::string strKlgFileName;

    int c = 0;
    while((c = getopt(argc, argv, "worts")) != -1)
    {
        switch(c)
        {
            case 'w'://Dataset directory root path
                option_count++;
                strWorkingDir = std::string(argv[optind]);
                break;
            case 'o'://klg filename
                option_count++;
                strKlgFileName = std::string(argv[optind]);
                break;
            case 'r'://associations.txt is in reverse order (rgb)(depth)
                option_count++;
                g_bFlag_reverse = true;

                break;
            case 't'://TUM format
                option_count++;
                g_bFlag_TUM = true;
                break;
            case 's'://TUM format
                option_count++;
                sscanf(argv[optind], "%lf", &g_dScale);
                break;
            default:
                break;
        }
    }
    if(option_count < 2)
    {
        fprintf(stderr, 
            "Usage: ./pngtoklg -w (working directory) -o (klg file name)\n"    
            "\n"
            "-w working directory\n"
            "-o output klg filename\n"
            "-t TUM format\n"
            "-s Scale factor in floating point ex.  '5000'\n"
            "For more scale factor detail, please reference: \nhttp://vision.in.tum.de/data/datasets/rgbd-dataset/file_formats#intrinsic_camera_calibration_of_the_kinect\n"
            "Example: ./pngtoklg -w ../livingroom_kt0_rs -o liv.klg\n"
            "associations.txt should be in (depth_time)(depth_file)(rgb_time)(rgb_file) order\n");
        return -1;
    }



    /// Change working directory
    int ret = chdir(strWorkingDir.c_str());
    if(ret != 0) 
    {
        fprintf(stderr, RED "dataset path not exist" NONE);
    }
    printf("\nCurrent working directory:\n\t%s\n", getcwd(NULL, 0));


    strAssociation_Path = strWorkingDir;
    if(strWorkingDir[strWorkingDir.length() - 1] != '/')
    {
        strAssociation_Path += '/';
    }
    strAssociation_Path += "associations.txt";
    
    /// Parse files
    // (timestamp, (depth path, rgb path) )
    VEC_INFO vec_info;


    int err = parseInfoFile(
                strAssociation_Path, 
                vec_info);
    if(err != 0)
    {
        fprintf(stderr, 
            RED "Fail to find associations.txt under working directory!\n" NONE); 
        return -1;
    }

    std::cout << "Depth: " << vec_info.back().second.first << std::endl;
    std::cout << "RGB: " << vec_info.back().second.second << std::endl;
    std::cout << "scale: " << g_dScale << std::endl;

    convertToKlg(vec_info, strKlgFileName);

    std::cout << "Conversion complete!\n";
    return 0;
}